

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

void open_file(char *file,char **search_dirs)

{
  FILE *fp;
  char *pcVar1;
  char **ppcVar2;
  char buf [4096];
  char acStack_1028 [4096];
  
  if (0x1f < file_stack_ptr) {
    fatal_input_error("Too many levels of nested #include\'s.\n");
  }
  if ((search_dirs == (char **)0x0) || (*file == '/')) {
    fp = fopen(file,"r");
    if (fp != (FILE *)0x0) goto LAB_0010627e;
  }
  else {
    pcVar1 = *search_dirs;
    if (pcVar1 != (char *)0x0) {
      ppcVar2 = search_dirs + 1;
      do {
        sprintf(acStack_1028,"%s/%s",pcVar1,file);
        fp = fopen(acStack_1028,"r");
        if (fp != (FILE *)0x0) goto LAB_0010627e;
        pcVar1 = *ppcVar2;
        ppcVar2 = ppcVar2 + 1;
      } while (pcVar1 != (char *)0x0);
    }
  }
  fatal_input_error("%s: No such file or directory.\n");
  fp = (FILE *)0x0;
LAB_0010627e:
  open_stream(file,(FILE *)fp);
  return;
}

Assistant:

void
open_file (const char *file, const char *search_dirs[])
{
  FILE *fp;
  const char **dir;
  char buf[4096];
  
  /* See if we've opened too many files already. */
  if (file_stack_ptr >= MAX_INCLUDE_DEPTH)
    fatal_input_error ("Too many levels of nested #include's.\n");

  /* If the filename has a leading slash, don't check directories.
   * Otherwise, check all the directories in the search path.
   */
  fp = NULL;
  if (file[0] == '/' || !search_dirs)
    fp = fopen (file, "r");
  else for (dir = &search_dirs[0]; *dir != NULL; dir++)
    {
      sprintf (buf, "%s/%s", *dir, file);
      fp = fopen (buf, "r");
      if (fp != NULL)
	break;
    }
  if (fp == NULL)
    fatal_input_error ("%s: No such file or directory.\n", file);

  open_stream (file, fp);
}